

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall tinyusdz::GPrim::set_primvar(GPrim *this,GeomPrimvar *primvar,string *err)

{
  pointer pSVar1;
  bool bVar2;
  mapped_type *pmVar3;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  *pvVar4;
  Sample *sample;
  pointer pSVar5;
  PrimVar var;
  string primvar_name;
  string index_name;
  Attribute attr;
  Attribute indices;
  storage_union local_be0;
  undefined1 *local_bd0;
  undefined1 local_bc8;
  undefined8 local_bc0;
  undefined1 uStack_bb8;
  undefined7 uStack_bb7;
  undefined1 uStack_bb0;
  undefined8 uStack_baf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  Attribute local_b60;
  undefined1 local_8b8 [8];
  size_type local_8b0;
  Attribute local_2d8;
  
  std::__cxx11::string::string((string *)local_8b8,(string *)primvar);
  std::__cxx11::string::_M_dispose();
  if (local_8b0 == 0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_8b8,(string *)primvar);
    std::__cxx11::string::string((string *)&local_b60,"primvars:",(allocator *)&local_2d8);
    bVar2 = startsWith((string *)local_8b8,&local_b60._name);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if (!bVar2) {
      std::__cxx11::string::string((string *)local_8b8,(string *)primvar);
      std::operator+(&local_ba0,"primvars:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b8)
      ;
      std::__cxx11::string::_M_dispose();
      Attribute::Attribute(&local_b60,&primvar->_attr);
      if ((primvar->_interpolation).has_value_ == true) {
        local_8b8._4_4_ = GeomPrimvar::get_interpolation(primvar);
        local_8b8[0] = (string)0x1;
        nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
                  (&local_b60._metas.interpolation,(optional<tinyusdz::Interpolation> *)local_8b8);
      }
      if ((primvar->_elementSize).has_value_ == true) {
        local_8b8._4_4_ = GeomPrimvar::get_elementSize(primvar);
        local_8b8[0] = (string)0x1;
        nonstd::optional_lite::optional<unsigned_int>::operator=
                  (&local_b60._metas.elementSize,(optional<unsigned_int> *)local_8b8);
      }
      Property::Property((Property *)local_8b8,&local_b60,false);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&this->props,&local_ba0);
      Property::operator=(pmVar3,(Property *)local_8b8);
      Property::~Property((Property *)local_8b8);
      local_bd0 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_be0.dynamic = (void *)0x0;
      local_bc8 = 0;
      local_bc0 = 0;
      uStack_bb8 = 0;
      uStack_bb7 = 0;
      uStack_bb0 = 0;
      uStack_baf = 0;
      if ((primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        linb::any::operator=((any *)&local_be0,&primvar->_indices);
      }
      bVar2 = GeomPrimvar::has_timesampled_indices(primvar);
      if (bVar2) {
        pvVar4 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::get_samples
                           (&primvar->_ts_indices);
        pSVar1 = (pvVar4->
                 super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pSVar5 = (pvVar4->
                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                      )._M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1;
            pSVar5 = pSVar5 + 1) {
          tinyusdz::primvar::PrimVar::set_timesample<std::vector<int,std::allocator<int>>>
                    ((PrimVar *)&local_be0,pSVar5->t,&pSVar5->value);
        }
      }
      if (((primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (bVar2 = GeomPrimvar::has_timesampled_indices(primvar), bVar2)) {
        Attribute::Attribute(&local_2d8);
        Attribute::set_var(&local_2d8,(PrimVar *)&local_be0);
        std::operator+(&local_b80,&local_ba0,":indices");
        Property::Property((Property *)local_8b8,&local_2d8,false);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](&this->props,&local_b80);
        Property::operator=(pmVar3,(Property *)local_8b8);
        Property::~Property((Property *)local_8b8);
        std::__cxx11::string::_M_dispose();
        Attribute::~Attribute(&local_2d8);
      }
      tinyusdz::primvar::PrimVar::~PrimVar((PrimVar *)&local_be0);
      Attribute::~Attribute(&local_b60);
      std::__cxx11::string::_M_dispose();
      return true;
    }
    if (err != (string *)0x0) {
      std::__cxx11::string::string((string *)&local_b60,(string *)primvar);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b8,
                     "GeomPrimvar.name must not start with `primvars:` namespace. name = ",
                     &local_b60._name);
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
  }
  return false;
}

Assistant:

bool GPrim::set_primvar(const GeomPrimvar &primvar,
                        std::string *err) {
  if (primvar.name().empty()) {
    if (err) {
      (*err) += "GeomPrimvar.name is empty.";
    }
    return false;
  }

  if (startsWith(primvar.name(), "primvars:")) {
    if (err) {
      (*err) += "GeomPrimvar.name must not start with `primvars:` namespace. name = " + primvar.name();
    }
    return false;
  }

  std::string primvar_name = kPrimvars + primvar.name();

  // Overwrite existing primvar prop.
  // TODO: Report warn when primvar name already exists.

  Attribute attr = primvar.get_attribute();

  if (primvar.has_interpolation()) {
    attr.metas().interpolation = primvar.get_interpolation();
  }

  if (primvar.has_elementSize()) {
    attr.metas().elementSize = primvar.get_elementSize();
  }

  props[primvar_name] = attr;

  {
    primvar::PrimVar var;

    if (primvar.has_default_indices()) {
      var.set_value(primvar.get_default_indices());
    }

    if (primvar.has_timesampled_indices()) {
      for (const auto &sample : primvar.get_timesampled_indices().get_samples()) {
        var.set_timesample(sample.t, sample.value);
      }
    }

    if (primvar.has_default_indices() || primvar.has_timesampled_indices()) {
      Attribute indices;
      indices.set_var(var);
      std::string index_name = primvar_name + kIndices;
      props[index_name] = indices;
    }

  }

  return true;
}